

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBPolynomialRow_C(uint8_t *src_argb,uint8_t *dst_argb,float *poly,int width)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  ulong uVar9;
  undefined1 auVar10 [13];
  long lVar11;
  float fVar12;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar13 [16];
  
  if (0 < width) {
    lVar11 = 0;
    do {
      uVar1 = *(undefined4 *)(src_argb + lVar11 * 4);
      uVar9 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar6._8_4_ = 0;
      auVar6._0_8_ = uVar9;
      auVar6[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar7[8] = (char)((uint)uVar1 >> 0x10);
      auVar7._0_8_ = uVar9;
      auVar7[9] = 0;
      auVar7._10_3_ = auVar6._10_3_;
      auVar10._5_8_ = 0;
      auVar10._0_5_ = auVar7._8_5_;
      auVar8[4] = (char)((uint)uVar1 >> 8);
      auVar8._0_4_ = (int)uVar9;
      auVar8[5] = 0;
      auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
      fVar12 = (float)(int)uVar9;
      fVar14 = (float)auVar8._4_4_;
      fVar15 = (float)auVar7._8_4_;
      fVar16 = (float)(uint3)(auVar6._10_3_ >> 0x10);
      auVar13._0_4_ =
           (int)(poly[8] * fVar12 * fVar12 + poly[4] * fVar12 + *poly +
                fVar12 * fVar12 * fVar12 * poly[0xc]);
      auVar13._4_4_ =
           (int)(poly[9] * fVar14 * fVar14 + poly[5] * fVar14 + poly[1] +
                fVar14 * fVar14 * fVar14 * poly[0xd]);
      auVar13._8_4_ =
           (int)(poly[10] * fVar15 * fVar15 + poly[6] * fVar15 + poly[2] +
                fVar15 * fVar15 * fVar15 * poly[0xe]);
      auVar13._12_4_ =
           (int)(poly[0xb] * fVar16 * fVar16 + poly[7] * fVar16 + poly[3] +
                fVar16 * fVar16 * fVar16 * poly[0xf]);
      auVar13 = packssdw(auVar13,auVar13);
      sVar2 = auVar13._0_2_;
      sVar3 = auVar13._2_2_;
      sVar4 = auVar13._4_2_;
      sVar5 = auVar13._6_2_;
      *(uint *)(dst_argb + lVar11 * 4) =
           CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar13[6] - (0xff < sVar5),
                    CONCAT12((0 < sVar4) * (sVar4 < 0x100) * auVar13[4] - (0xff < sVar4),
                             CONCAT11((0 < sVar3) * (sVar3 < 0x100) * auVar13[2] - (0xff < sVar3),
                                      (0 < sVar2) * (sVar2 < 0x100) * auVar13[0] - (0xff < sVar2))))
      ;
      lVar11 = lVar11 + 1;
    } while (width != (int)lVar11);
  }
  return;
}

Assistant:

void ARGBPolynomialRow_C(const uint8_t* src_argb,
                         uint8_t* dst_argb,
                         const float* poly,
                         int width) {
  int i;
  for (i = 0; i < width; ++i) {
    float b = (float)(src_argb[0]);
    float g = (float)(src_argb[1]);
    float r = (float)(src_argb[2]);
    float a = (float)(src_argb[3]);
    float b2 = b * b;
    float g2 = g * g;
    float r2 = r * r;
    float a2 = a * a;
    float db = poly[0] + poly[4] * b;
    float dg = poly[1] + poly[5] * g;
    float dr = poly[2] + poly[6] * r;
    float da = poly[3] + poly[7] * a;
    float b3 = b2 * b;
    float g3 = g2 * g;
    float r3 = r2 * r;
    float a3 = a2 * a;
    db += poly[8] * b2;
    dg += poly[9] * g2;
    dr += poly[10] * r2;
    da += poly[11] * a2;
    db += poly[12] * b3;
    dg += poly[13] * g3;
    dr += poly[14] * r3;
    da += poly[15] * a3;

    dst_argb[0] = Clamp((int32_t)(db));
    dst_argb[1] = Clamp((int32_t)(dg));
    dst_argb[2] = Clamp((int32_t)(dr));
    dst_argb[3] = Clamp((int32_t)(da));
    src_argb += 4;
    dst_argb += 4;
  }
}